

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newstate(lua_Alloc f,void *ud)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  LG *l;
  global_State *g;
  lua_State *L;
  int i;
  void *ud_local;
  lua_Alloc f_local;
  
  pvVar3 = (*f)(ud,(void *)0x0,8,0x670);
  if (pvVar3 == (void *)0x0) {
    f_local = (lua_Alloc)0x0;
  }
  else {
    g = (global_State *)((long)pvVar3 + 0x10);
    *(code **)((long)pvVar3 + 0x650) = raviE_default_writeline;
    *(code **)((long)pvVar3 + 0x658) = raviE_default_writestring;
    *(code **)((long)pvVar3 + 0x660) = raviE_default_writestringerror;
    *(undefined8 *)((long)pvVar3 + 0x668) = 0;
    g->frealloc = (lua_Alloc)0x0;
    *(undefined1 *)((long)pvVar3 + 0x18) = 8;
    *(undefined1 *)((long)pvVar3 + 0x134) = 8;
    *(byte *)((long)pvVar3 + 0x19) = *(byte *)((long)pvVar3 + 0x134) & 0x18;
    preinit_thread((lua_State *)g,(global_State *)((long)pvVar3 + 0xe0));
    if (9 < (*(byte *)((long)pvVar3 + 0x18) & 0xf)) {
      __assert_fail("(((L)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                    ,0x17d,"lua_State *lua_newstate(lua_Alloc, void *)");
    }
    *(global_State **)((long)pvVar3 + 0x140) = g;
    g->frealloc = (lua_Alloc)0x0;
    ((global_State *)((long)pvVar3 + 0xe0))->frealloc = f;
    *(void **)((long)pvVar3 + 0xe8) = ud;
    *(global_State **)((long)pvVar3 + 0x1d8) = g;
    uVar1 = makeseed((lua_State *)g);
    *(uint *)((long)pvVar3 + 0x130) = uVar1;
    *(undefined1 *)((long)pvVar3 + 0x13a) = 2;
    *(undefined4 *)((long)pvVar3 + 0x118) = 0;
    *(undefined4 *)((long)pvVar3 + 0x11c) = 0;
    *(undefined8 *)((long)pvVar3 + 0x110) = 0;
    *(undefined2 *)((long)pvVar3 + 0x128) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1d0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1e0) = 0;
    *(undefined1 *)((long)pvVar3 + 0x135) = 8;
    *(undefined1 *)((long)pvVar3 + 0x136) = 0;
    *(undefined1 *)((long)pvVar3 + 0x137) = 0;
    *(undefined1 *)((long)pvVar3 + 0x13b) = 0;
    *(undefined8 *)((long)pvVar3 + 0x188) = 0;
    *(undefined8 *)((long)pvVar3 + 0x180) = 0;
    *(undefined8 *)((long)pvVar3 + 0x150) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x198) = 0;
    *(undefined8 *)((long)pvVar3 + 400) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1a8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1c0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1b8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1b0) = 0;
    *(undefined8 *)((long)pvVar3 + 0x148) = 0;
    *(undefined8 *)((long)pvVar3 + 0x160) = 0;
    *(undefined8 *)((long)pvVar3 + 0x158) = 0;
    *(undefined8 *)((long)pvVar3 + 0x178) = 0;
    *(undefined8 *)((long)pvVar3 + 0x170) = 0;
    *(undefined8 *)((long)pvVar3 + 0x168) = 0;
    *(undefined8 *)((long)pvVar3 + 0x1c8) = 0;
    *(undefined8 *)((long)pvVar3 + 0xf0) = 0x670;
    *(undefined8 *)((long)pvVar3 + 0xf8) = 0;
    *(undefined8 *)((long)pvVar3 + 0x108) = 0;
    *(undefined1 *)((long)pvVar3 + 0x13c) = 0x32;
    *(undefined1 *)((long)pvVar3 + 0x13d) = 0x19;
    *(undefined1 *)((long)pvVar3 + 0x13e) = 0xd;
    *(undefined1 *)((long)pvVar3 + 0x139) = 0x19;
    *(undefined1 *)((long)pvVar3 + 0x138) = 0x14;
    for (L._4_4_ = 0; L._4_4_ < 9; L._4_4_ = L._4_4_ + 1) {
      *(undefined8 *)((long)pvVar3 + (long)L._4_4_ * 8 + 0x2b0) = 0;
    }
    *(undefined8 *)((long)pvVar3 + 0x648) = 0;
    raviV_initjit((lua_State *)g);
    iVar2 = luaD_rawrunprotected((lua_State *)g,f_luaopen,(void *)0x0);
    if (iVar2 != 0) {
      close_state((lua_State *)g);
      g = (global_State *)0x0;
    }
    f_local = (lua_Alloc)g;
  }
  return (lua_State *)f_local;
}

Assistant:

LUA_API lua_State *lua_newstate (lua_Alloc f, void *ud) {
  int i;
  lua_State *L;
  global_State *g;

  LG *l = cast(LG *, (*f)(ud, NULL, LUA_TTHREAD, sizeof(LG)));
  if (l == NULL) return NULL;
  L = &l->l.l;
  g = &l->g;
  g->ravi_writeline = raviE_default_writeline;
  g->ravi_writestring = raviE_default_writestring;
  g->ravi_writestringerror = raviE_default_writestringerror;
  g->ravi_debugger_data = NULL;
  L->next = NULL;
  L->tt = LUA_TTHREAD;
  g->currentwhite = bitmask(WHITE0BIT);
  L->marked = luaC_white(g);
  preinit_thread(L, g);
  g->allgc = obj2gco(L);  /* by now, only object is the main thread */
  L->next = NULL;
  g->frealloc = f;
  g->ud = ud;
  g->mainthread = L;
  g->seed = makeseed(L);
  g->gcstp = GCSTPGC;  /* no GC while building state */
  g->strt.size = g->strt.nuse = 0;
  g->strt.hash = NULL;
  setnilvalue(&g->l_registry);
  g->panic = NULL;
  g->version = NULL;
  g->gcstate = GCSpause;
  g->gckind = KGC_INC;
  g->gcstopem = 0;
  g->gcemergency = 0;
  g->finobj = g->tobefnz = g->fixedgc = NULL;
  g->firstold1 = g->survival = g->old1 = g->reallyold = NULL;
  g->finobjsur = g->finobjold1 = g->finobjrold = NULL;
  g->sweepgc = NULL;
  g->gray = g->grayagain = NULL;
  g->weak = g->ephemeron = g->allweak = NULL;
  g->twups = NULL;
  g->totalbytes = sizeof(LG);
  g->GCdebt = 0;
  g->lastatomic = 0;
  setgcparam(g->gcpause, LUAI_GCPAUSE);
  setgcparam(g->gcstepmul, LUAI_GCMUL);
  g->gcstepsize = LUAI_GCSTEPSIZE;
  setgcparam(g->genmajormul, LUAI_GENMAJORMUL);
  g->genminormul = LUAI_GENMINORMUL;
  for (i=0; i < LUA_NUMTAGS; i++) g->mt[i] = NULL;
  g->ravi_state = NULL;
  raviV_initjit(L);
  if (luaD_rawrunprotected(L, f_luaopen, NULL) != LUA_OK) {
    /* memory allocation error: free partial state */
    close_state(L);
    L = NULL;
  }
#if RAVI_BYTECODE_PROFILING_ENABLED
  raviV_init_profiledata(L);
#endif
  return L;
}